

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

bool __thiscall
SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U>::contains
          (SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this,InplaceStr *key)

{
  InplaceStr *pIVar1;
  bool bVar2;
  ulong uVar3;
  InplaceStr local_60;
  InplaceStr *local_50;
  InplaceStr *item;
  char *pcStack_40;
  uint i;
  char *local_38;
  InplaceStrHasher local_29;
  uint local_28;
  uint local_24;
  uint bucket;
  uint bucketMask;
  InplaceStr *key_local;
  SmallDenseSet<InplaceStr,_InplaceStrHasher,_2U> *this_local;
  
  local_24 = this->bucketCount - 1;
  pcStack_40 = key->begin;
  local_38 = key->end;
  _bucket = key;
  key_local = (InplaceStr *)this;
  local_28 = InplaceStrHasher::operator()(&local_29,*key);
  local_28 = local_28 & local_24;
  item._4_4_ = 0;
  while( true ) {
    if (this->bucketCount <= item._4_4_) {
      return false;
    }
    pIVar1 = this->data;
    uVar3 = (ulong)local_28;
    local_50 = pIVar1 + uVar3;
    InplaceStr::InplaceStr(&local_60);
    bVar2 = InplaceStr::operator==(pIVar1 + uVar3,&local_60);
    if (bVar2) break;
    bVar2 = InplaceStr::operator==(local_50,_bucket);
    if (bVar2) {
      return true;
    }
    local_28 = local_28 + item._4_4_ + 1 & local_24;
    item._4_4_ = item._4_4_ + 1;
  }
  return false;
}

Assistant:

bool contains(const Key& key)
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Key &item = data[bucket];

			if(item == Key())
				return false;

			if(item == key)
				return true;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return false;
	}